

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall
Parser::addIncludesRecursive(Parser *this,QString *filename,QList<QString> *includes)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  bool bVar4;
  int iVar5;
  int __oflag;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_168;
  QArrayDataPointer<char16_t> local_148;
  QFileInfo info2;
  QArrayDataPointer<char16_t> local_128;
  QArrayDataPointer<char16_t> local_108;
  QRegularExpressionMatch match;
  QRegularExpressionMatchIterator i;
  QRegularExpression includeMacro;
  QTextStream stream;
  QArrayDataPointer<char16_t> local_c8;
  QIODevice local_a8;
  QFileInfo info;
  QStringBuilder<QString,_QLatin1Char> local_88;
  QStringBuilder<QStringBuilder<QString,_QLatin1Char>,_QString_&> local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  info.d_ptr.d.ptr = (QSharedDataPointer<QFileInfoPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QFileInfo::QFileInfo(&info,filename);
  local_a8._vptr_QIODevice = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.d_ptr._M_t.
  super___uniq_ptr_impl<QIODevicePrivate,_std::default_delete<QIODevicePrivate>_>._M_t.
  super__Tuple_impl<0UL,_QIODevicePrivate_*,_std::default_delete<QIODevicePrivate>_>.
  super__Head_base<0UL,_QIODevicePrivate_*,_false>._M_head_impl =
       (__uniq_ptr_data<QIODevicePrivate,_std::default_delete<QIODevicePrivate>,_true,_true>)
       &DAT_aaaaaaaaaaaaaaaa;
  QFile::QFile((QFile *)&local_a8,filename);
  iVar5 = QFile::open((QFile *)&local_a8,(char *)0x11,__oflag);
  if ((char)iVar5 != '\0') {
    local_c8.size = 0;
    local_c8.d = (Data *)0x0;
    local_c8.ptr = (char16_t *)0x0;
    stream.d_ptr._M_t.
    super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>._M_t.
    super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>.
    super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl =
         (unique_ptr<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>)
         &DAT_aaaaaaaaaaaaaaaa;
    QTextStream::QTextStream(&stream,&local_a8);
    while( true ) {
      bVar4 = QTextStream::atEnd(&stream);
      if (bVar4) break;
      local_68.a.a.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_68.a.a.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_68.a.a.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      QTextStream::readLine(&local_88.a,&stream,0);
      QString::trimmed_helper((QString *)&local_68,&local_88.a);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
      local_88.a.d.ptr = (char16_t *)CONCAT71(local_88.a.d.ptr._1_7_,10);
      local_88.a.d.d = (Data *)&local_68;
      operator+=((QString *)&local_c8,(QStringBuilder<QString_&,_QLatin1Char> *)&local_88);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    }
    includeMacro.d.d.ptr =
         (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    local_68.a.a.d.d = (Data *)0x0;
    local_88.a.d.d = (Data *)0x0;
    local_88.a.d.ptr = (char16_t *)0x0;
    local_68.a.a.d.ptr = L"#include [\"<]([A-Za-z0-9_./-]*.h)[\">]";
    local_88.a.d.size = 0;
    local_68.a.a.d.size = 0x25;
    QRegularExpression::QRegularExpression(&includeMacro,(QString *)&local_68,(PatternOptions)0x0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
    i.d.d.ptr = (QExplicitlySharedDataPointer<QRegularExpressionMatchIteratorPrivate>)
                &DAT_aaaaaaaaaaaaaaaa;
    QRegularExpression::globalMatch
              ((QRegularExpression *)&i,(QString *)&includeMacro,(qsizetype)&local_c8,NormalMatch,
               (MatchOptions)0x0);
    while( true ) {
      bVar4 = QRegularExpressionMatchIterator::hasNext(&i);
      if (!bVar4) break;
      match.d.d.ptr =
           (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)&DAT_aaaaaaaaaaaaaaaa;
      QRegularExpressionMatchIterator::next((QRegularExpressionMatchIterator *)&match);
      local_108.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_108.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_108.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      QRegularExpressionMatch::captured((QString *)&local_108,&match,1);
      local_128.d = local_108.d;
      local_128.ptr = local_108.ptr;
      local_128.size = local_108.size;
      if (local_108.d != (Data *)0x0) {
        LOCK();
        ((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_88.a.d.d = (Data *)0x0;
      local_88.a.d.ptr = (char16_t *)0x0;
      local_68.a.a.d.d = (Data *)0x0;
      local_68.a.a.d.ptr = L"../";
      local_88.a.d.size = 0;
      local_68.a.a.d.size = 3;
      bVar4 = QString::startsWith((QString *)&local_108,(QString *)&local_68,CaseSensitive);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
      if (bVar4) {
        info2.d_ptr.d.ptr = (QSharedDataPointer<QFileInfoPrivate>)&DAT_aaaaaaaaaaaaaaaa;
        QFileInfo::absolutePath((QString *)&local_168,&info);
        local_88.a.d.size = local_168.size;
        local_88.a.d.ptr = local_168.ptr;
        local_88.a.d.d = local_168.d;
        local_168.d = (Data *)0x0;
        local_168.ptr = (char16_t *)0x0;
        local_168.size = 0;
        local_88.b.ch = '/';
        QStringBuilder<QString,_QLatin1Char>::QStringBuilder(&local_68.a,&local_88);
        local_68.b = (QString *)&local_108;
        QStringBuilder<QStringBuilder<QString,_QLatin1Char>,_QString_&>::convertTo<QString>
                  ((QString *)&local_148,&local_68);
        QFileInfo::QFileInfo(&info2,(QString *)&local_148);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_148);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_168);
        bVar4 = QFileInfo::exists(&info2);
        if (bVar4) {
          QFileInfo::absoluteFilePath((QString *)&local_68,&info2);
          qVar3 = local_128.size;
          pcVar2 = local_128.ptr;
          pDVar1 = local_128.d;
          local_128.d = local_68.a.a.d.d;
          local_128.ptr = local_68.a.a.d.ptr;
          local_68.a.a.d.d = pDVar1;
          local_68.a.a.d.ptr = pcVar2;
          local_128.size = local_68.a.a.d.size;
          local_68.a.a.d.size = qVar3;
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
          QFileInfo::fileName((QString *)&local_68,&info2);
          qVar3 = local_108.size;
          pcVar2 = local_108.ptr;
          pDVar1 = local_108.d;
          local_108.d = local_68.a.a.d.d;
          local_108.ptr = local_68.a.a.d.ptr;
          local_68.a.a.d.d = pDVar1;
          local_68.a.a.d.ptr = pcVar2;
          local_108.size = local_68.a.a.d.size;
          local_68.a.a.d.size = qVar3;
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
          QFileInfo::~QFileInfo(&info2);
          goto LAB_001095ae;
        }
        QFileInfo::~QFileInfo(&info2);
      }
      else {
LAB_001095ae:
        QFileInfo::QFileInfo((QFileInfo *)&local_88,(QString *)&local_108);
        QFileInfo::baseName((QString *)&local_68,(QFileInfo *)&local_88);
        bVar4 = QString::startsWith((QString *)&local_68,(QChar)0x71,CaseInsensitive);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
        QFileInfo::~QFileInfo((QFileInfo *)&local_88);
        if (bVar4) {
          local_68.a.a.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_68.a.a.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_68.a.a.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          resolveInclude((QString *)&local_68,this,(QString *)&local_128);
          if ((undefined1 *)local_68.a.a.d.size != (undefined1 *)0x0) {
            bVar4 = QListSpecialMethods<QString>::contains
                              ((QListSpecialMethods<QString> *)includes,(QString *)&local_68,
                               CaseSensitive);
            if (!bVar4) {
              QList<QString>::emplaceBack<QString_const&>(includes,(QString *)&local_68);
              addIncludesRecursive(this,(QString *)&local_68,includes);
            }
          }
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
        }
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_128);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_108);
      QRegularExpressionMatch::~QRegularExpressionMatch(&match);
    }
    QRegularExpressionMatchIterator::~QRegularExpressionMatchIterator(&i);
    QRegularExpression::~QRegularExpression(&includeMacro);
    QTextStream::~QTextStream(&stream);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
  }
  QFile::~QFile((QFile *)&local_a8);
  QFileInfo::~QFileInfo(&info);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Parser::addIncludesRecursive(const QString &filename, QList<QString> &includes)
{
    QFileInfo info(filename);
    DEBUGPRINTF(printf("check include: %s\n", qPrintable(filename)));
    QFile input(filename);
    if (!input.open(QIODevice::ReadOnly | QIODevice::Text)) {
        DEBUGPRINTF(printf("Cannot open '%s' for reading: %s\n",
                            qPrintable(filename), qPrintable(input.errorString())));
        return;
    }
    QString data;
    QTextStream stream(&input);
    while (!stream.atEnd()) {
        QString line = stream.readLine().trimmed();
        data += line + QLatin1Char(QLatin1Char('\n'));
    }

    QRegularExpression includeMacro(QStringLiteral("#include [\"<]([A-Za-z0-9_./-]*.h)[\">]"));
    QRegularExpressionMatchIterator i = includeMacro.globalMatch(data);
    while (i.hasNext()) {
        QRegularExpressionMatch match = i.next();
        QString filename = match.captured(1);

        QString rinc = filename;
        if (filename.startsWith(QStringLiteral("../"))) {
            QFileInfo info2(info.absolutePath() + QLatin1Char('/') + filename);
            if (!info2.exists()) {
                DEBUGPRINTF(printf("unable to find %s\n", qPrintable(filename)));
                continue;
            }
            rinc = info2.absoluteFilePath();
            filename = info2.fileName();
        }
        // only search possible qt headers
        if (QFileInfo(filename).baseName().startsWith(QLatin1Char('q'), Qt::CaseInsensitive)) {
            QString resolved = resolveInclude(rinc);
            if (!resolved.isEmpty() && !includes.contains(resolved)) {
                includes.push_back(resolved);
                addIncludesRecursive(resolved, includes);
            }
        }
    }
}